

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O1

Amap_Obj_t * Amap_ManCreatePo(Amap_Man_t *p,Amap_Obj_t *pFan0)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Amap_Obj_t *pAVar3;
  void **ppvVar4;
  uint *puVar5;
  int iVar6;
  
  pAVar3 = Amap_ManSetupObj(p);
  *(ulong *)pAVar3 =
       *(ulong *)pAVar3 & 0xe0000000ffffffff | (ulong)(p->vPos->nSize & 0x1fffffff) << 0x20;
  pVVar2 = p->vPos;
  uVar1 = pVVar2->nCap;
  if (pVVar2->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar4;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar1 * 2;
      if (iVar6 <= (int)uVar1) goto LAB_0043f2d8;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
      }
      pVVar2->pArray = ppvVar4;
    }
    pVVar2->nCap = iVar6;
  }
LAB_0043f2d8:
  iVar6 = pVVar2->nSize;
  pVVar2->nSize = iVar6 + 1;
  pVVar2->pArray[iVar6] = pAVar3;
  *(ulong *)pAVar3 = *(ulong *)pAVar3 & 0xfffffffffffffff8 | 3;
  puVar5 = (uint *)((ulong)pFan0 & 0xfffffffffffffffe);
  pAVar3->Fan[0] = ((uint)pFan0 & 1) + (*puVar5 >> 3) * 2;
  puVar5[4] = puVar5[4] + 1;
  uVar1 = puVar5[2];
  pAVar3->Level = uVar1;
  if (p->nLevelMax < (int)uVar1) {
    p->nLevelMax = uVar1;
  }
  if (p->nLevelMax < 0xffe) {
    p->nObjs[3] = p->nObjs[3] + 1;
    return pAVar3;
  }
  __assert_fail("p->nLevelMax < 4094",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapGraph.c"
                ,0x79,"Amap_Obj_t *Amap_ManCreatePo(Amap_Man_t *, Amap_Obj_t *)");
}

Assistant:

Amap_Obj_t * Amap_ManCreatePo( Amap_Man_t * p, Amap_Obj_t * pFan0 )
{
    Amap_Obj_t * pObj;
    pObj = Amap_ManSetupObj( p );
    pObj->IdPio  = Vec_PtrSize( p->vPos );
    Vec_PtrPush( p->vPos, pObj );
    pObj->Type   = AMAP_OBJ_PO;
    pObj->Fan[0] = Amap_ObjToLit(pFan0);  Amap_Regular(pFan0)->nRefs++;
    pObj->Level  = Amap_Regular(pFan0)->Level;
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    assert( p->nLevelMax < 4094 ); // 2^12-2
    p->nObjs[AMAP_OBJ_PO]++;
    return pObj;
}